

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_certificate_request
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  uint8_t *msg;
  int ret;
  uint8_t *end;
  uint8_t *src;
  ptls_handshake_properties_t *properties_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  msg = message.base;
  if (((byte)tls->field_0x1e8 >> 1 & 1) == 0) {
    message_local.len._4_4_ =
         decode_certificate_request
                   (tls,&(tls->field_19).client.certificate_request,msg + 4,msg + message.len);
    if (message_local.len._4_4_ == 0) {
      if ((tls->field_19).client.certificate_request.context.len == 0) {
        tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
        ptls__key_schedule_update_hash(tls->key_schedule,msg,message.len,0);
        message_local.len._4_4_ = 0x202;
      }
      else {
        message_local.len._4_4_ = 0x2f;
      }
    }
    return message_local.len._4_4_;
  }
  __assert_fail("!tls->is_psk_handshake && \"state machine asserts that this message is never delivered when PSK is used\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                ,0xca0,
                "int client_handle_certificate_request(ptls_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
               );
}

Assistant:

static int client_handle_certificate_request(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    int ret = 0;

    assert(!tls->is_psk_handshake && "state machine asserts that this message is never delivered when PSK is used");

    if ((ret = decode_certificate_request(tls, &tls->client.certificate_request, src, end)) != 0)
        return ret;

    /* This field SHALL be zero length unless used for the post-handshake authentication exchanges (section 4.3.2) */
    if (tls->client.certificate_request.context.len != 0)
        return PTLS_ALERT_ILLEGAL_PARAMETER;

    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len, 0);

    return PTLS_ERROR_IN_PROGRESS;
}